

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::TryConsumeEndOfDeclaration
          (Parser *this,char *text,LocationRecorder *location)

{
  bool bVar1;
  undefined1 local_68 [8];
  string trailing;
  string leading;
  LocationRecorder *location_local;
  char *text_local;
  Parser *this_local;
  
  bVar1 = LookingAt(this,text);
  if (bVar1) {
    std::__cxx11::string::string((string *)(trailing.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_68);
    io::Tokenizer::NextWithComments
              (this->input_,(string *)local_68,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x0,(string *)(trailing.field_2._M_local_buf + 8));
    std::__cxx11::string::swap((string *)(trailing.field_2._M_local_buf + 8));
    if (location != (LocationRecorder *)0x0) {
      LocationRecorder::AttachComments
                (location,(string *)((long)&trailing.field_2 + 8),(string *)local_68);
    }
    this_local._7_1_ = true;
    std::__cxx11::string::~string((string *)local_68);
    std::__cxx11::string::~string((string *)(trailing.field_2._M_local_buf + 8));
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::TryConsumeEndOfDeclaration(const char* text,
                                        const LocationRecorder* location) {
  if (LookingAt(text)) {
    string leading, trailing;
    input_->NextWithComments(&trailing, NULL, &leading);

    // Save the leading comments for next time, and recall the leading comments
    // from last time.
    leading.swap(upcoming_doc_comments_);

    if (location != NULL) {
      location->AttachComments(&leading, &trailing);
    }
    return true;
  } else {
    return false;
  }
}